

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_value_constructor_unordered_set_Test::
~ObjectTest_basic_value_constructor_unordered_set_Test
          (ObjectTest_basic_value_constructor_unordered_set_Test *this)

{
  ObjectTest_basic_value_constructor_unordered_set_Test *this_local;
  
  ~ObjectTest_basic_value_constructor_unordered_set_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_value_constructor_unordered_set) {
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::unordered_set<bool>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::unordered_set<signed char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::unordered_set<unsigned char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::unordered_set<short>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::unordered_set<int>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::unordered_set<long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::unordered_set<long long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::unordered_set<intmax_t>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::unordered_set<float>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::unordered_set<double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::unordered_set<long double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::unordered_set<std::u8string>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::unordered_set<object>);
}